

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O2

void processnonterm(parsenoderec *thisnode)

{
  int iVar1;
  long lVar2;
  parsenoderec *ppVar3;
  
  currentlevel = thisnode->level + 1;
  lVar2 = (long)prodtable[thisnode->ParseItem][thistoken];
  if (lVar2 != 0) {
    if ((long)prodindex[lVar2].prlength != 0) {
      iVar1 = prodindex[lVar2].prstart;
      lVar2 = (long)prodindex[lVar2].prlength + (long)iVar1;
      ppVar3 = getparsenode(*(termtagtype *)(&DAT_0010b468 + lVar2 * 8),
                            *(int *)(&DAT_0010b46c + lVar2 * 8));
      parsepush(ppVar3);
      for (lVar2 = (long)((int)lVar2 + -2); iVar1 <= lVar2; lVar2 = lVar2 + -1) {
        ppVar3 = getparsenode(prodarray[lVar2].PrTermOrNonterm,prodarray[lVar2].PrParseItem);
        parsepush(ppVar3);
      }
    }
    return;
  }
  putchar(0x22);
  printlexeme(thistoken);
  error("\" cannot be used this way",linenum);
}

Assistant:

void processnonterm(struct parsenoderec *thisnode)
{
    struct parsenoderec	*p;
    int	prodnum, i;
    
    currentlevel = thisnode -> level +1;
    if ((prodnum = prodtable[thisnode -> ParseItem][thistoken]) == 0){
        putchar('\"');
        printlexeme(thistoken);
        error("\" cannot be used this way", linenum);
    }
    
    if (prodindex[prodnum].prlength != 0)	{
        i = prodindex[prodnum].prstart + prodindex[prodnum].prlength - 1;
        p = getparsenode(prodarray[i].PrTermOrNonterm, prodarray[i].PrParseItem);
        parsepush(p);
        
        for (i = prodindex[prodnum].prstart + prodindex[prodnum].prlength - 2;
             i >= prodindex[prodnum].prstart;  --i)	{
            p = getparsenode(prodarray[i].PrTermOrNonterm, prodarray[i].PrParseItem);
            parsepush(p);
        }
    }
    
}